

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

double calcAbsMax<float>(TWaveformT<float> *waveform)

{
  pointer pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  pfVar1 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)(waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar1) >> 2;
  uVar4 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  dVar5 = 0.0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar6 = (double)ABS(pfVar1[uVar4]);
    if (dVar6 <= dVar5) {
      dVar6 = dVar5;
    }
    dVar5 = dVar6;
  }
  return dVar5;
}

Assistant:

double calcAbsMax(const TWaveformT<TSample> & waveform) {
    double amax = 0.0f;
    for (auto i = 0; i < (int) waveform.size(); ++i) if (std::abs(waveform[i]) > amax) amax = std::abs(waveform[i]);

    return amax;
}